

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

bool __thiscall
FxStructMember::RequestAddress(FxStructMember *this,FCompileContext *ctx,bool *writable)

{
  bool bVar1;
  byte local_32;
  byte local_31;
  bool *writable_local;
  FCompileContext *ctx_local;
  FxStructMember *this_local;
  
  if ((this->membervar->Flags & 0x2000) == 0) {
    this->AddressRequested = true;
    if (writable != (bool *)0x0) {
      local_31 = 0;
      if ((this->AddressWritable & 1U) != 0) {
        bVar1 = FCompileContext::CheckReadOnly(ctx,this->membervar->Flags);
        local_31 = 0;
        if (!bVar1) {
          bVar1 = DObject::IsKindOf((DObject *)this->classx->ValueType,
                                    PPointer::RegistrationInfo.MyClass);
          local_32 = 1;
          if (bVar1) {
            local_32 = *(byte *)&this->classx->ValueType[1].super_PTypeBase.super_DObject.Class ^
                       0xff;
          }
          local_31 = local_32;
        }
      }
      *writable = (bool)(local_31 & 1);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FxStructMember::RequestAddress(FCompileContext &ctx, bool *writable)
{
	// Cannot take the address of metadata variables.
	if (membervar->Flags & VARF_Static)
	{
		return false;
	}
	AddressRequested = true;
	if (writable != nullptr) *writable = (AddressWritable && !ctx.CheckReadOnly(membervar->Flags) &&
											(!classx->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) || !static_cast<PPointer*>(classx->ValueType)->IsConst));
	return true;
}